

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyaddr.c
# Opt level: O0

ares_status_t file_lookup(host_query *hquery)

{
  ares_bool_t aVar1;
  ares_status_t local_24;
  ares_hosts_entry_t *paStack_20;
  ares_status_t status;
  ares_hosts_entry_t *entry;
  host_query *hquery_local;
  
  entry = (ares_hosts_entry_t *)hquery;
  aVar1 = ares_is_onion_domain(hquery->name);
  if (aVar1 == ARES_FALSE) {
    local_24 = ares_hosts_search_host
                         ((ares_channel_t *)entry->refcnt,
                          (uint)(((ulong)entry[1].hosts & 0x100) != 0),(char *)entry->ips,
                          &stack0xffffffffffffffe0);
    if (local_24 == ARES_SUCCESS) {
      local_24 = ares_hosts_entry_to_addrinfo
                           (paStack_20,(char *)entry->ips,*(int *)((long)&entry[1].hosts + 4),
                            *(unsigned_short *)&entry->hosts,
                            (uint)(((ulong)entry[1].hosts & 1) != 0),(ares_addrinfo *)entry[4].hosts
                           );
    }
    if ((local_24 == ARES_ENOMEM) ||
       (aVar1 = ares_is_localhost((char *)entry->ips), aVar1 == ARES_FALSE)) {
      hquery_local._4_4_ = local_24;
    }
    else {
      hquery_local._4_4_ =
           ares_addrinfo_localhost
                     ((char *)entry->ips,*(unsigned_short *)&entry->hosts,
                      (ares_addrinfo_hints *)&entry[1].hosts,(ares_addrinfo *)entry[4].hosts);
    }
  }
  else {
    hquery_local._4_4_ = ARES_ENOTFOUND;
  }
  return hquery_local._4_4_;
}

Assistant:

static ares_status_t file_lookup(ares_channel_t         *channel,
                                 const struct ares_addr *addr,
                                 struct hostent        **host)
{
  char                      ipaddr[INET6_ADDRSTRLEN];
  const void               *ptr = NULL;
  const ares_hosts_entry_t *entry;
  ares_status_t             status;

  if (addr->family == AF_INET) {
    ptr = &addr->addr.addr4;
  } else if (addr->family == AF_INET6) {
    ptr = &addr->addr.addr6;
  }

  if (ptr == NULL) {
    return ARES_ENOTFOUND;
  }

  if (!ares_inet_ntop(addr->family, ptr, ipaddr, sizeof(ipaddr))) {
    return ARES_ENOTFOUND;
  }

  status = ares_hosts_search_ipaddr(channel, ARES_FALSE, ipaddr, &entry);
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_hosts_entry_to_hostent(entry, addr->family, host);
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  return ARES_SUCCESS;
}